

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-test.c++
# Opt level: O3

void __thiscall kj::_::anon_unknown_0::TestCase84::run(TestCase84 *this)

{
  bool bVar1;
  double dVar2;
  char *pcVar3;
  size_t sVar4;
  char cVar5;
  uchar uVar6;
  short sVar7;
  unsigned_short uVar8;
  int iVar9;
  uint uVar10;
  float fVar11;
  String local_4268;
  DebugExpression<bool> _kjCondition_57;
  DebugExpression<bool> _kjCondition_56;
  undefined4 uStack_4244;
  int local_4238 [4];
  DebugComparison<double,_double> _kjCondition;
  DebugExpression<bool> _kjCondition_15;
  undefined7 uStack_408f;
  DebugExpression<bool> _kjCondition_28;
  StringPtr local_3d60;
  StringPtr local_3d50;
  StringPtr local_3d40;
  StringPtr local_3d30;
  StringPtr local_3d20;
  StringPtr local_3d10;
  StringPtr local_3d00;
  StringPtr local_3cf0;
  StringPtr local_3ce0;
  StringPtr local_3cd0;
  StringPtr local_3cc0;
  StringPtr local_3cb0;
  StringPtr local_3ca0;
  StringPtr local_3c90;
  StringPtr local_3c80;
  StringPtr local_3c70;
  StringPtr local_3c60;
  StringPtr local_3c50;
  StringPtr local_3c40;
  StringPtr local_3c30;
  double local_3c20 [51];
  double local_3a88 [51];
  DebugExpression<bool> _kjCondition_30;
  undefined4 uStack_38ec;
  DebugExpression<bool> _kjCondition_29;
  DebugExpression<bool> _kjCondition_46;
  undefined4 uStack_35bc;
  DebugExpression<bool> _kjCondition_18;
  DebugExpression<bool> _kjCondition_44;
  DebugExpression<bool> _kjCondition_20;
  undefined4 uStack_30f4;
  DebugExpression<bool> _kjCondition_19;
  DebugExpression<bool> _kjCondition_47;
  DebugExpression<bool> _kjCondition_45;
  undefined4 uStack_2c2c;
  DebugExpression<bool> _kjCondition_51;
  DebugExpression<bool> _kjCondition_43;
  DebugExpression<bool> _kjCondition_42;
  DebugExpression<bool> _kjCondition_31;
  DebugExpression<bool> _kjCondition_27;
  DebugExpression<bool> _kjCondition_26;
  DebugExpression<bool> _kjCondition_21;
  DebugExpression<bool> _kjCondition_52;
  
  __kjCondition_15 = "0";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = _kjCondition.left == 0.0;
  _kjCondition.right = 0.0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((_kjCondition.left != 0.0) || (NAN(_kjCondition.left))) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "0";
    local_3a88[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_3c20[0] = 0.0;
    Debug::log<char_const(&)[53],kj::_::DebugComparison<double,double>&,double,double>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x55,ERROR,
               "\"failed: expected \" \"(\\\"0\\\"_kj.parseAs<double>()) == (0.0)\", _kjCondition, \"0\"_kj.parseAs<double>(), 0.0"
               ,(char (*) [53])"failed: expected (\"0\"_kj.parseAs<double>()) == (0.0)",
               &_kjCondition,local_3a88,local_3c20);
  }
  __kjCondition_15 = "0.0";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = _kjCondition.left == 0.0;
  _kjCondition.right = 0.0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((_kjCondition.left != 0.0) || (NAN(_kjCondition.left))) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "0.0";
    local_3a88[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_3c20[0] = 0.0;
    Debug::log<char_const(&)[55],kj::_::DebugComparison<double,double>&,double,double>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x56,ERROR,
               "\"failed: expected \" \"(\\\"0.0\\\"_kj.parseAs<double>()) == (0.0)\", _kjCondition, \"0.0\"_kj.parseAs<double>(), 0.0"
               ,(char (*) [55])"failed: expected (\"0.0\"_kj.parseAs<double>()) == (0.0)",
               &_kjCondition,local_3a88,local_3c20);
  }
  __kjCondition_15 = "1";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = _kjCondition.left == 1.0;
  _kjCondition.right = 1.0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((_kjCondition.left != 1.0) || (NAN(_kjCondition.left))) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1";
    local_3a88[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_3c20[0] = 1.0;
    Debug::log<char_const(&)[53],kj::_::DebugComparison<double,double>&,double,double>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x57,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<double>()) == (1.0)\", _kjCondition, \"1\"_kj.parseAs<double>(), 1.0"
               ,(char (*) [53])"failed: expected (\"1\"_kj.parseAs<double>()) == (1.0)",
               &_kjCondition,local_3a88,local_3c20);
  }
  __kjCondition_15 = "1.0";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = _kjCondition.left == 1.0;
  _kjCondition.right = 1.0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((_kjCondition.left != 1.0) || (NAN(_kjCondition.left))) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1.0";
    local_3a88[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_3c20[0] = 1.0;
    Debug::log<char_const(&)[55],kj::_::DebugComparison<double,double>&,double,double>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x58,ERROR,
               "\"failed: expected \" \"(\\\"1.0\\\"_kj.parseAs<double>()) == (1.0)\", _kjCondition, \"1.0\"_kj.parseAs<double>(), 1.0"
               ,(char (*) [55])"failed: expected (\"1.0\"_kj.parseAs<double>()) == (1.0)",
               &_kjCondition,local_3a88,local_3c20);
  }
  __kjCondition_15 = "1e100";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = _kjCondition.left == 1e+100;
  _kjCondition.right = 1e+100;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((_kjCondition.left != 1e+100) || (NAN(_kjCondition.left))) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1e100";
    local_3a88[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_3c20[0] = 1e+100;
    Debug::log<char_const(&)[59],kj::_::DebugComparison<double,double>&,double,double>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x59,ERROR,
               "\"failed: expected \" \"(\\\"1e100\\\"_kj.parseAs<double>()) == (1e100)\", _kjCondition, \"1e100\"_kj.parseAs<double>(), 1e100"
               ,(char (*) [59])"failed: expected (\"1e100\"_kj.parseAs<double>()) == (1e100)",
               &_kjCondition,local_3a88,local_3c20);
  }
  __kjCondition_15 = "inf";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = INFINITY <= _kjCondition.left;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0x7f800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "inf";
    local_3a88[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_3c20[0] = (double)CONCAT44(local_3c20[0]._4_4_,0x7f800000);
    Debug::log<char_const(&)[57],kj::_::DebugComparison<double,float>&,double,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x5a,ERROR,
               "\"failed: expected \" \"(\\\"inf\\\"_kj.parseAs<double>()) == (inf())\", _kjCondition, \"inf\"_kj.parseAs<double>(), inf()"
               ,(char (*) [57])"failed: expected (\"inf\"_kj.parseAs<double>()) == (inf())",
               (DebugComparison<double,_float> *)&_kjCondition,local_3a88,(float *)local_3c20);
  }
  __kjCondition_15 = "infinity";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = INFINITY <= _kjCondition.left;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0x7f800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "infinity";
    local_3a88[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_3c20[0] = (double)CONCAT44(local_3c20[0]._4_4_,0x7f800000);
    Debug::log<char_const(&)[62],kj::_::DebugComparison<double,float>&,double,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x5b,ERROR,
               "\"failed: expected \" \"(\\\"infinity\\\"_kj.parseAs<double>()) == (inf())\", _kjCondition, \"infinity\"_kj.parseAs<double>(), inf()"
               ,(char (*) [62])"failed: expected (\"infinity\"_kj.parseAs<double>()) == (inf())",
               (DebugComparison<double,_float> *)&_kjCondition,local_3a88,(float *)local_3c20);
  }
  __kjCondition_15 = "INF";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = INFINITY <= _kjCondition.left;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0x7f800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "INF";
    local_3a88[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_3c20[0] = (double)CONCAT44(local_3c20[0]._4_4_,0x7f800000);
    Debug::log<char_const(&)[57],kj::_::DebugComparison<double,float>&,double,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x5c,ERROR,
               "\"failed: expected \" \"(\\\"INF\\\"_kj.parseAs<double>()) == (inf())\", _kjCondition, \"INF\"_kj.parseAs<double>(), inf()"
               ,(char (*) [57])"failed: expected (\"INF\"_kj.parseAs<double>()) == (inf())",
               (DebugComparison<double,_float> *)&_kjCondition,local_3a88,(float *)local_3c20);
  }
  __kjCondition_15 = "INFINITY";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = INFINITY <= _kjCondition.left;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0x7f800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "INFINITY";
    local_3a88[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_3c20[0] = (double)CONCAT44(local_3c20[0]._4_4_,0x7f800000);
    Debug::log<char_const(&)[62],kj::_::DebugComparison<double,float>&,double,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x5d,ERROR,
               "\"failed: expected \" \"(\\\"INFINITY\\\"_kj.parseAs<double>()) == (inf())\", _kjCondition, \"INFINITY\"_kj.parseAs<double>(), inf()"
               ,(char (*) [62])"failed: expected (\"INFINITY\"_kj.parseAs<double>()) == (inf())",
               (DebugComparison<double,_float> *)&_kjCondition,local_3a88,(float *)local_3c20);
  }
  __kjCondition_15 = "1e100000";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = INFINITY <= _kjCondition.left;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0x7f800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "1e100000";
    local_3a88[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_3c20[0] = (double)CONCAT44(local_3c20[0]._4_4_,0x7f800000);
    Debug::log<char_const(&)[62],kj::_::DebugComparison<double,float>&,double,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x5e,ERROR,
               "\"failed: expected \" \"(\\\"1e100000\\\"_kj.parseAs<double>()) == (inf())\", _kjCondition, \"1e100000\"_kj.parseAs<double>(), inf()"
               ,(char (*) [62])"failed: expected (\"1e100000\"_kj.parseAs<double>()) == (inf())",
               (DebugComparison<double,_float> *)&_kjCondition,local_3a88,(float *)local_3c20);
  }
  __kjCondition_15 = "-inf";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = _kjCondition.left <= -INFINITY;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xff800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "-inf";
    local_3a88[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_3c20[0] = (double)CONCAT44(local_3c20[0]._4_4_,0xff800000);
    Debug::log<char_const(&)[59],kj::_::DebugComparison<double,float>&,double,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x5f,ERROR,
               "\"failed: expected \" \"(\\\"-inf\\\"_kj.parseAs<double>()) == (-inf())\", _kjCondition, \"-inf\"_kj.parseAs<double>(), -inf()"
               ,(char (*) [59])"failed: expected (\"-inf\"_kj.parseAs<double>()) == (-inf())",
               (DebugComparison<double,_float> *)&_kjCondition,local_3a88,(float *)local_3c20);
  }
  __kjCondition_15 = "-infinity";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = _kjCondition.left <= -INFINITY;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xff800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "-infinity";
    local_3a88[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_3c20[0] = (double)CONCAT44(local_3c20[0]._4_4_,0xff800000);
    Debug::log<char_const(&)[64],kj::_::DebugComparison<double,float>&,double,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x60,ERROR,
               "\"failed: expected \" \"(\\\"-infinity\\\"_kj.parseAs<double>()) == (-inf())\", _kjCondition, \"-infinity\"_kj.parseAs<double>(), -inf()"
               ,(char (*) [64])"failed: expected (\"-infinity\"_kj.parseAs<double>()) == (-inf())",
               (DebugComparison<double,_float> *)&_kjCondition,local_3a88,(float *)local_3c20);
  }
  __kjCondition_15 = "-INF";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = _kjCondition.left <= -INFINITY;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xff800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "-INF";
    local_3a88[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_3c20[0] = (double)CONCAT44(local_3c20[0]._4_4_,0xff800000);
    Debug::log<char_const(&)[59],kj::_::DebugComparison<double,float>&,double,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x61,ERROR,
               "\"failed: expected \" \"(\\\"-INF\\\"_kj.parseAs<double>()) == (-inf())\", _kjCondition, \"-INF\"_kj.parseAs<double>(), -inf()"
               ,(char (*) [59])"failed: expected (\"-INF\"_kj.parseAs<double>()) == (-inf())",
               (DebugComparison<double,_float> *)&_kjCondition,local_3a88,(float *)local_3c20);
  }
  __kjCondition_15 = "-INFINITY";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = _kjCondition.left <= -INFINITY;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xff800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "-INFINITY";
    local_3a88[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_3c20[0] = (double)CONCAT44(local_3c20[0]._4_4_,0xff800000);
    Debug::log<char_const(&)[64],kj::_::DebugComparison<double,float>&,double,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x62,ERROR,
               "\"failed: expected \" \"(\\\"-INFINITY\\\"_kj.parseAs<double>()) == (-inf())\", _kjCondition, \"-INFINITY\"_kj.parseAs<double>(), -inf()"
               ,(char (*) [64])"failed: expected (\"-INFINITY\"_kj.parseAs<double>()) == (-inf())",
               (DebugComparison<double,_float> *)&_kjCondition,local_3a88,(float *)local_3c20);
  }
  __kjCondition_15 = "-1e100000";
  _kjCondition.left = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
  _kjCondition.result = _kjCondition.left <= -INFINITY;
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xff800000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_15 = "-1e100000";
    local_3a88[0] = StringPtr::parseAs<double>((StringPtr *)&_kjCondition_15);
    local_3c20[0] = (double)CONCAT44(local_3c20[0]._4_4_,0xff800000);
    Debug::log<char_const(&)[64],kj::_::DebugComparison<double,float>&,double,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,99,ERROR,
               "\"failed: expected \" \"(\\\"-1e100000\\\"_kj.parseAs<double>()) == (-inf())\", _kjCondition, \"-1e100000\"_kj.parseAs<double>(), -inf()"
               ,(char (*) [64])"failed: expected (\"-1e100000\"_kj.parseAs<double>()) == (-inf())",
               (DebugComparison<double,_float> *)&_kjCondition,local_3a88,(float *)local_3c20);
  }
  _kjCondition.left = (double)anon_var_dwarf_a9833;
  _kjCondition.right = 1.97626258336499e-323;
  dVar2 = StringPtr::parseAs<double>((StringPtr *)&_kjCondition);
  bVar1 = NAN(dVar2);
  _kjCondition_15.value = bVar1;
  if ((!bVar1) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[51],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,100,ERROR,
               "\"failed: expected \" \"isNaN(\\\"nan\\\"_kj.parseAs<double>())\", _kjCondition",
               (char (*) [51])"failed: expected isNaN(\"nan\"_kj.parseAs<double>())",
               &_kjCondition_15);
  }
  _kjCondition.left = (double)anon_var_dwarf_a9862;
  _kjCondition.right = 1.97626258336499e-323;
  dVar2 = StringPtr::parseAs<double>((StringPtr *)&_kjCondition);
  _kjCondition_15.value = NAN(dVar2);
  if ((!_kjCondition_15.value) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[51],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x65,ERROR,
               "\"failed: expected \" \"isNaN(\\\"NAN\\\"_kj.parseAs<double>())\", _kjCondition",
               (char (*) [51])"failed: expected isNaN(\"NAN\"_kj.parseAs<double>())",
               &_kjCondition_15);
  }
  _kjCondition.left = (double)anon_var_dwarf_a9883;
  _kjCondition.right = 1.97626258336499e-323;
  dVar2 = StringPtr::parseAs<double>((StringPtr *)&_kjCondition);
  __kjCondition_15 = (char *)CONCAT71(uStack_408f,NAN(dVar2));
  if ((!NAN(dVar2)) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[51],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x66,ERROR,
               "\"failed: expected \" \"isNaN(\\\"NaN\\\"_kj.parseAs<double>())\", _kjCondition",
               (char (*) [51])"failed: expected isNaN(\"NaN\"_kj.parseAs<double>())",
               &_kjCondition_15);
  }
  local_3d60.content.ptr = "";
  local_3d60.content.size_ = 1;
  StringPtr::parseAs<double>(&local_3d60);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[44]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x67,ERROR,"\"code did not throw: \" \"\\\"\\\"_kj.parseAs<double>()\"",
               (char (*) [44])"code did not throw: \"\"_kj.parseAs<double>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_3d50.content.ptr = "a";
  local_3d50.content.size_ = 2;
  StringPtr::parseAs<double>(&local_3d50);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x68,ERROR,"\"code did not throw: \" \"\\\"a\\\"_kj.parseAs<double>()\"",
               (char (*) [45])"code did not throw: \"a\"_kj.parseAs<double>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_3d40.content.ptr = "1a";
  local_3d40.content.size_ = 3;
  StringPtr::parseAs<double>(&local_3d40);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x69,ERROR,"\"code did not throw: \" \"\\\"1a\\\"_kj.parseAs<double>()\"",
               (char (*) [46])"code did not throw: \"1a\"_kj.parseAs<double>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_3d30.content.ptr = "+-1";
  local_3d30.content.size_ = 4;
  StringPtr::parseAs<double>(&local_3d30);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[47]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x6a,ERROR,"\"code did not throw: \" \"\\\"+-1\\\"_kj.parseAs<double>()\"",
               (char (*) [47])"code did not throw: \"+-1\"_kj.parseAs<double>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  __kjCondition_18 = "1";
  fVar11 = StringPtr::parseAs<float>((StringPtr *)&_kjCondition_18);
  _kjCondition.result = fVar11 == 1.0;
  _kjCondition.left = (double)CONCAT44(_kjCondition.left._4_4_,fVar11);
  _kjCondition.right = 1.0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if (((fVar11 != 1.0) || (NAN(fVar11))) && (Debug::minSeverity < 3)) {
    __kjCondition_18 = "1";
    fVar11 = StringPtr::parseAs<float>((StringPtr *)&_kjCondition_18);
    __kjCondition_20 = CONCAT44(uStack_30f4,fVar11);
    __kjCondition_19 = 0x3ff0000000000000;
    Debug::log<char_const(&)[52],kj::_::DebugComparison<float,double>&,float,double>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x6c,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<float>()) == (1.0)\", _kjCondition, \"1\"_kj.parseAs<float>(), 1.0"
               ,(char (*) [52])"failed: expected (\"1\"_kj.parseAs<float>()) == (1.0)",
               (DebugComparison<float,_double> *)&_kjCondition,(float *)&_kjCondition_20,
               (double *)&_kjCondition_19);
  }
  __kjCondition_18 = "1";
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_18);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 4.94065645841247e-324;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_18 = "1";
    __kjCondition_19 = StringPtr::parseAs<long>((StringPtr *)&_kjCondition_18);
    __kjCondition_20 = CONCAT44(uStack_30f4,1);
    Debug::log<char_const(&)[52],kj::_::DebugComparison<long,int>&,long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x6e,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<int64_t>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<int64_t>(), 1"
               ,(char (*) [52])"failed: expected (\"1\"_kj.parseAs<int64_t>()) == (1)",
               (DebugComparison<long,_int> *)&_kjCondition,(long *)&_kjCondition_19,
               (int *)&_kjCondition_20);
  }
  __kjCondition_18 = "9223372036854775807";
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_18);
  _kjCondition.right = NAN;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == NAN;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_18 = "9223372036854775807";
    __kjCondition_19 = StringPtr::parseAs<long>((StringPtr *)&_kjCondition_18);
    __kjCondition_20 = 0x7fffffffffffffff;
    Debug::log<char_const(&)[90],kj::_::DebugComparison<long,long_long>&,long,long_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x6f,ERROR,
               "\"failed: expected \" \"(\\\"9223372036854775807\\\"_kj.parseAs<int64_t>()) == (9223372036854775807LL)\", _kjCondition, \"9223372036854775807\"_kj.parseAs<int64_t>(), 9223372036854775807LL"
               ,(char (*) [90])
                "failed: expected (\"9223372036854775807\"_kj.parseAs<int64_t>()) == (9223372036854775807LL)"
               ,(DebugComparison<long,_long_long> *)&_kjCondition,(long *)&_kjCondition_19,
               (longlong *)&_kjCondition_20);
  }
  __kjCondition_18 = "-9223372036854775808";
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_18);
  _kjCondition.right = -0.0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == -0.0;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_18 = "-9223372036854775808";
    __kjCondition_19 = StringPtr::parseAs<long>((StringPtr *)&_kjCondition_18);
    __kjCondition_20 = 0x8000000000000000;
    Debug::
    log<char_const(&)[93],kj::_::DebugComparison<long,unsigned_long_long>&,long,unsigned_long_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x70,ERROR,
               "\"failed: expected \" \"(\\\"-9223372036854775808\\\"_kj.parseAs<int64_t>()) == (-9223372036854775808ULL)\", _kjCondition, \"-9223372036854775808\"_kj.parseAs<int64_t>(), -9223372036854775808ULL"
               ,(char (*) [93])
                "failed: expected (\"-9223372036854775808\"_kj.parseAs<int64_t>()) == (-9223372036854775808ULL)"
               ,(DebugComparison<long,_unsigned_long_long> *)&_kjCondition,(long *)&_kjCondition_19,
               (unsigned_long_long *)&_kjCondition_20);
  }
  local_3d20.content.ptr = "9223372036854775808";
  local_3d20.content.size_ = 0x14;
  StringPtr::parseAs<long>(&local_3d20);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[64]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x71,ERROR,
               "\"code did not throw: \" \"\\\"9223372036854775808\\\"_kj.parseAs<int64_t>()\"",
               (char (*) [64])"code did not throw: \"9223372036854775808\"_kj.parseAs<int64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_3d10.content.ptr = "-9223372036854775809";
  local_3d10.content.size_ = 0x15;
  StringPtr::parseAs<long>(&local_3d10);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[65]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x72,ERROR,
               "\"code did not throw: \" \"\\\"-9223372036854775809\\\"_kj.parseAs<int64_t>()\"",
               (char (*) [65])"code did not throw: \"-9223372036854775809\"_kj.parseAs<int64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_3d00.content.ptr = "";
  local_3d00.content.size_ = 1;
  StringPtr::parseAs<long>(&local_3d00);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x73,ERROR,"\"code did not throw: \" \"\\\"\\\"_kj.parseAs<int64_t>()\"",
               (char (*) [45])"code did not throw: \"\"_kj.parseAs<int64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_3cf0.content.ptr = "a";
  local_3cf0.content.size_ = 2;
  StringPtr::parseAs<long>(&local_3cf0);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x74,ERROR,"\"code did not throw: \" \"\\\"a\\\"_kj.parseAs<int64_t>()\"",
               (char (*) [46])"code did not throw: \"a\"_kj.parseAs<int64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_3ce0.content.ptr = "1a";
  local_3ce0.content.size_ = 3;
  StringPtr::parseAs<long>(&local_3ce0);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[47]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x75,ERROR,"\"code did not throw: \" \"\\\"1a\\\"_kj.parseAs<int64_t>()\"",
               (char (*) [47])"code did not throw: \"1a\"_kj.parseAs<int64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_3cd0.content.ptr = "+-1";
  local_3cd0.content.size_ = 4;
  StringPtr::parseAs<long>(&local_3cd0);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x76,ERROR,"\"code did not throw: \" \"\\\"+-1\\\"_kj.parseAs<int64_t>()\"",
               (char (*) [48])"code did not throw: \"+-1\"_kj.parseAs<int64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  __kjCondition_28 = "010";
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_28);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,10);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 4.94065645841247e-323;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_28 = "010";
    __kjCondition_29 = StringPtr::parseAs<long>((StringPtr *)&_kjCondition_28);
    __kjCondition_30 = CONCAT44(uStack_38ec,10);
    Debug::log<char_const(&)[55],kj::_::DebugComparison<long,int>&,long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x77,ERROR,
               "\"failed: expected \" \"(\\\"010\\\"_kj.parseAs<int64_t>()) == (10)\", _kjCondition, \"010\"_kj.parseAs<int64_t>(), 10"
               ,(char (*) [55])"failed: expected (\"010\"_kj.parseAs<int64_t>()) == (10)",
               (DebugComparison<long,_int> *)&_kjCondition,(long *)&_kjCondition_29,
               (int *)&_kjCondition_30);
  }
  __kjCondition_28 = "0010";
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_28);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,10);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 4.94065645841247e-323;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_28 = "0010";
    __kjCondition_29 = StringPtr::parseAs<long>((StringPtr *)&_kjCondition_28);
    __kjCondition_30 = CONCAT44(uStack_38ec,10);
    Debug::log<char_const(&)[56],kj::_::DebugComparison<long,int>&,long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x78,ERROR,
               "\"failed: expected \" \"(\\\"0010\\\"_kj.parseAs<int64_t>()) == (10)\", _kjCondition, \"0010\"_kj.parseAs<int64_t>(), 10"
               ,(char (*) [56])"failed: expected (\"0010\"_kj.parseAs<int64_t>()) == (10)",
               (DebugComparison<long,_int> *)&_kjCondition,(long *)&_kjCondition_29,
               (int *)&_kjCondition_30);
  }
  __kjCondition_28 = "0x10";
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_28);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0x10);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 7.90505033345994e-323;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_28 = "0x10";
    __kjCondition_29 = StringPtr::parseAs<long>((StringPtr *)&_kjCondition_28);
    __kjCondition_30 = CONCAT44(uStack_38ec,0x10);
    Debug::log<char_const(&)[56],kj::_::DebugComparison<long,int>&,long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x79,ERROR,
               "\"failed: expected \" \"(\\\"0x10\\\"_kj.parseAs<int64_t>()) == (16)\", _kjCondition, \"0x10\"_kj.parseAs<int64_t>(), 16"
               ,(char (*) [56])"failed: expected (\"0x10\"_kj.parseAs<int64_t>()) == (16)",
               (DebugComparison<long,_int> *)&_kjCondition,(long *)&_kjCondition_29,
               (int *)&_kjCondition_30);
  }
  __kjCondition_28 = "0X10";
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_28);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0x10);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 7.90505033345994e-323;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_28 = "0X10";
    __kjCondition_29 = StringPtr::parseAs<long>((StringPtr *)&_kjCondition_28);
    __kjCondition_30 = CONCAT44(uStack_38ec,0x10);
    Debug::log<char_const(&)[56],kj::_::DebugComparison<long,int>&,long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x7a,ERROR,
               "\"failed: expected \" \"(\\\"0X10\\\"_kj.parseAs<int64_t>()) == (16)\", _kjCondition, \"0X10\"_kj.parseAs<int64_t>(), 16"
               ,(char (*) [56])"failed: expected (\"0X10\"_kj.parseAs<int64_t>()) == (16)",
               (DebugComparison<long,_int> *)&_kjCondition,(long *)&_kjCondition_29,
               (int *)&_kjCondition_30);
  }
  __kjCondition_28 = "-010";
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_28);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xfffffff6);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == -NAN;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_28 = "-010";
    __kjCondition_29 = StringPtr::parseAs<long>((StringPtr *)&_kjCondition_28);
    __kjCondition_30 = CONCAT44(uStack_38ec,0xfffffff6);
    Debug::log<char_const(&)[57],kj::_::DebugComparison<long,int>&,long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x7b,ERROR,
               "\"failed: expected \" \"(\\\"-010\\\"_kj.parseAs<int64_t>()) == (-10)\", _kjCondition, \"-010\"_kj.parseAs<int64_t>(), -10"
               ,(char (*) [57])"failed: expected (\"-010\"_kj.parseAs<int64_t>()) == (-10)",
               (DebugComparison<long,_int> *)&_kjCondition,(long *)&_kjCondition_29,
               (int *)&_kjCondition_30);
  }
  __kjCondition_28 = "-0x10";
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_28);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xfffffff0);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == -NAN;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_28 = "-0x10";
    __kjCondition_29 = StringPtr::parseAs<long>((StringPtr *)&_kjCondition_28);
    __kjCondition_30 = CONCAT44(uStack_38ec,0xfffffff0);
    Debug::log<char_const(&)[58],kj::_::DebugComparison<long,int>&,long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x7c,ERROR,
               "\"failed: expected \" \"(\\\"-0x10\\\"_kj.parseAs<int64_t>()) == (-16)\", _kjCondition, \"-0x10\"_kj.parseAs<int64_t>(), -16"
               ,(char (*) [58])"failed: expected (\"-0x10\"_kj.parseAs<int64_t>()) == (-16)",
               (DebugComparison<long,_int> *)&_kjCondition,(long *)&_kjCondition_29,
               (int *)&_kjCondition_30);
  }
  __kjCondition_28 = "-0X10";
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&_kjCondition_28);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,0xfffffff0);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == -NAN;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_28 = "-0X10";
    __kjCondition_29 = StringPtr::parseAs<long>((StringPtr *)&_kjCondition_28);
    __kjCondition_30 = CONCAT44(uStack_38ec,0xfffffff0);
    Debug::log<char_const(&)[58],kj::_::DebugComparison<long,int>&,long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x7d,ERROR,
               "\"failed: expected \" \"(\\\"-0X10\\\"_kj.parseAs<int64_t>()) == (-16)\", _kjCondition, \"-0X10\"_kj.parseAs<int64_t>(), -16"
               ,(char (*) [58])"failed: expected (\"-0X10\"_kj.parseAs<int64_t>()) == (-16)",
               (DebugComparison<long,_int> *)&_kjCondition,(long *)&_kjCondition_29,
               (int *)&_kjCondition_30);
  }
  __kjCondition_28 = "1";
  _kjCondition.left = (double)StringPtr::parseAs<unsigned_long>((StringPtr *)&_kjCondition_28);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 4.94065645841247e-324;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_28 = "1";
    __kjCondition_29 = StringPtr::parseAs<unsigned_long>((StringPtr *)&_kjCondition_28);
    __kjCondition_30 = CONCAT44(uStack_38ec,1);
    Debug::log<char_const(&)[53],kj::_::DebugComparison<unsigned_long,int>&,unsigned_long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x7f,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<uint64_t>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<uint64_t>(), 1"
               ,(char (*) [53])"failed: expected (\"1\"_kj.parseAs<uint64_t>()) == (1)",
               (DebugComparison<unsigned_long,_int> *)&_kjCondition,
               (unsigned_long *)&_kjCondition_29,(int *)&_kjCondition_30);
  }
  __kjCondition_28 = "0";
  _kjCondition.left = (double)StringPtr::parseAs<unsigned_long>((StringPtr *)&_kjCondition_28);
  _kjCondition.right = (double)((ulong)_kjCondition.right & 0xffffffff00000000);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 0.0;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_28 = "0";
    __kjCondition_29 = StringPtr::parseAs<unsigned_long>((StringPtr *)&_kjCondition_28);
    __kjCondition_30 = __kjCondition_30 & 0xffffffff00000000;
    Debug::log<char_const(&)[53],kj::_::DebugComparison<unsigned_long,int>&,unsigned_long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x80,ERROR,
               "\"failed: expected \" \"(\\\"0\\\"_kj.parseAs<uint64_t>()) == (0)\", _kjCondition, \"0\"_kj.parseAs<uint64_t>(), 0"
               ,(char (*) [53])"failed: expected (\"0\"_kj.parseAs<uint64_t>()) == (0)",
               (DebugComparison<unsigned_long,_int> *)&_kjCondition,
               (unsigned_long *)&_kjCondition_29,(int *)&_kjCondition_30);
  }
  __kjCondition_28 = "18446744073709551615";
  _kjCondition.left = (double)StringPtr::parseAs<unsigned_long>((StringPtr *)&_kjCondition_28);
  _kjCondition.right = -NAN;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == -NAN;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    __kjCondition_28 = "18446744073709551615";
    __kjCondition_29 = StringPtr::parseAs<unsigned_long>((StringPtr *)&_kjCondition_28);
    __kjCondition_30 = 0xffffffffffffffff;
    Debug::
    log<char_const(&)[94],kj::_::DebugComparison<unsigned_long,unsigned_long_long>&,unsigned_long,unsigned_long_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x81,ERROR,
               "\"failed: expected \" \"(\\\"18446744073709551615\\\"_kj.parseAs<uint64_t>()) == (18446744073709551615ULL)\", _kjCondition, \"18446744073709551615\"_kj.parseAs<uint64_t>(), 18446744073709551615ULL"
               ,(char (*) [94])
                "failed: expected (\"18446744073709551615\"_kj.parseAs<uint64_t>()) == (18446744073709551615ULL)"
               ,(DebugComparison<unsigned_long,_unsigned_long_long> *)&_kjCondition,
               (unsigned_long *)&_kjCondition_29,(unsigned_long_long *)&_kjCondition_30);
  }
  local_3cc0.content.ptr = "-1";
  local_3cc0.content.size_ = 3;
  StringPtr::parseAs<unsigned_long>(&local_3cc0);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x82,ERROR,"\"code did not throw: \" \"\\\"-1\\\"_kj.parseAs<uint64_t>()\"",
               (char (*) [48])"code did not throw: \"-1\"_kj.parseAs<uint64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_3cb0.content.ptr = "18446744073709551616";
  local_3cb0.content.size_ = 0x15;
  StringPtr::parseAs<unsigned_long>(&local_3cb0);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[66]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x83,ERROR,
               "\"code did not throw: \" \"\\\"18446744073709551616\\\"_kj.parseAs<uint64_t>()\"",
               (char (*) [66])"code did not throw: \"18446744073709551616\"_kj.parseAs<uint64_t>()")
    ;
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_3ca0.content.ptr = "";
  local_3ca0.content.size_ = 1;
  StringPtr::parseAs<unsigned_long>(&local_3ca0);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[46]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x84,ERROR,"\"code did not throw: \" \"\\\"\\\"_kj.parseAs<uint64_t>()\"",
               (char (*) [46])"code did not throw: \"\"_kj.parseAs<uint64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_3c90.content.ptr = "a";
  local_3c90.content.size_ = 2;
  StringPtr::parseAs<unsigned_long>(&local_3c90);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[47]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x85,ERROR,"\"code did not throw: \" \"\\\"a\\\"_kj.parseAs<uint64_t>()\"",
               (char (*) [47])"code did not throw: \"a\"_kj.parseAs<uint64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_3c80.content.ptr = "1a";
  local_3c80.content.size_ = 3;
  StringPtr::parseAs<unsigned_long>(&local_3c80);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x86,ERROR,"\"code did not throw: \" \"\\\"1a\\\"_kj.parseAs<uint64_t>()\"",
               (char (*) [48])"code did not throw: \"1a\"_kj.parseAs<uint64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_3c70.content.ptr = "+-1";
  local_3c70.content.size_ = 4;
  StringPtr::parseAs<unsigned_long>(&local_3c70);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[49]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x87,ERROR,"\"code did not throw: \" \"\\\"+-1\\\"_kj.parseAs<uint64_t>()\"",
               (char (*) [49])"code did not throw: \"+-1\"_kj.parseAs<uint64_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  __kjCondition_44 = "1";
  iVar9 = StringPtr::parseAs<int>((StringPtr *)&_kjCondition_44);
  _kjCondition.left = (double)CONCAT44(1,iVar9);
  _kjCondition.right = (double)anon_var_dwarf_19d17;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar9 == 1);
  if ((iVar9 != 1) && (Debug::minSeverity < 3)) {
    __kjCondition_44 = "1";
    iVar9 = StringPtr::parseAs<int>((StringPtr *)&_kjCondition_44);
    __kjCondition_45 = CONCAT44(uStack_2c2c,iVar9);
    __kjCondition_46 = (char *)CONCAT44(uStack_35bc,1);
    Debug::log<char_const(&)[52],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x89,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<int32_t>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<int32_t>(), 1"
               ,(char (*) [52])"failed: expected (\"1\"_kj.parseAs<int32_t>()) == (1)",
               (DebugComparison<int,_int> *)&_kjCondition,(int *)&_kjCondition_45,
               (int *)&_kjCondition_46);
  }
  __kjCondition_44 = "2147483647";
  iVar9 = StringPtr::parseAs<int>((StringPtr *)&_kjCondition_44);
  _kjCondition.left = (double)CONCAT44(0x7fffffff,iVar9);
  _kjCondition.right = (double)anon_var_dwarf_19d17;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar9 == 0x7fffffff);
  if ((iVar9 != 0x7fffffff) && (Debug::minSeverity < 3)) {
    __kjCondition_44 = "2147483647";
    iVar9 = StringPtr::parseAs<int>((StringPtr *)&_kjCondition_44);
    __kjCondition_45 = CONCAT44(uStack_2c2c,iVar9);
    __kjCondition_46 = (char *)CONCAT44(uStack_35bc,0x7fffffff);
    Debug::log<char_const(&)[70],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x8a,ERROR,
               "\"failed: expected \" \"(\\\"2147483647\\\"_kj.parseAs<int32_t>()) == (2147483647)\", _kjCondition, \"2147483647\"_kj.parseAs<int32_t>(), 2147483647"
               ,(char (*) [70])
                "failed: expected (\"2147483647\"_kj.parseAs<int32_t>()) == (2147483647)",
               (DebugComparison<int,_int> *)&_kjCondition,(int *)&_kjCondition_45,
               (int *)&_kjCondition_46);
  }
  __kjCondition_44 = "-2147483648";
  iVar9 = StringPtr::parseAs<int>((StringPtr *)&_kjCondition_44);
  _kjCondition.left = (double)CONCAT44(_kjCondition.left._4_4_,iVar9);
  _kjCondition.right = -NAN;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = false;
  if (Debug::minSeverity < 3) {
    __kjCondition_44 = "-2147483648";
    iVar9 = StringPtr::parseAs<int>((StringPtr *)&_kjCondition_44);
    __kjCondition_46 = (char *)CONCAT44(uStack_35bc,iVar9);
    __kjCondition_45 = 0xffffffff80000000;
    Debug::log<char_const(&)[72],kj::_::DebugComparison<int,long>&,int,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x8b,ERROR,
               "\"failed: expected \" \"(\\\"-2147483648\\\"_kj.parseAs<int32_t>()) == (-2147483648)\", _kjCondition, \"-2147483648\"_kj.parseAs<int32_t>(), -2147483648"
               ,(char (*) [72])
                "failed: expected (\"-2147483648\"_kj.parseAs<int32_t>()) == (-2147483648)",
               (DebugComparison<int,_long> *)&_kjCondition,(int *)&_kjCondition_46,
               (long *)&_kjCondition_45);
  }
  local_3c60.content.ptr = "2147483648";
  local_3c60.content.size_ = 0xb;
  StringPtr::parseAs<int>(&local_3c60);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[55]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x8c,ERROR,"\"code did not throw: \" \"\\\"2147483648\\\"_kj.parseAs<int32_t>()\"",
               (char (*) [55])"code did not throw: \"2147483648\"_kj.parseAs<int32_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_3c50.content.ptr = "-2147483649";
  local_3c50.content.size_ = 0xc;
  StringPtr::parseAs<int>(&local_3c50);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[56]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x8d,ERROR,"\"code did not throw: \" \"\\\"-2147483649\\\"_kj.parseAs<int32_t>()\"",
               (char (*) [56])"code did not throw: \"-2147483649\"_kj.parseAs<int32_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  __kjCondition_46 = "1";
  uVar10 = StringPtr::parseAs<unsigned_int>((StringPtr *)&_kjCondition_46);
  _kjCondition.left = (double)CONCAT44(1,uVar10);
  _kjCondition.right = (double)anon_var_dwarf_19d17;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar10 == 1);
  if ((uVar10 != 1) && (Debug::minSeverity < 3)) {
    __kjCondition_46 = "1";
    __kjCondition_47 = StringPtr::parseAs<unsigned_int>((StringPtr *)&_kjCondition_46);
    __kjCondition_51 = 1;
    Debug::log<char_const(&)[53],kj::_::DebugComparison<unsigned_int,int>&,unsigned_int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x8f,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<uint32_t>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<uint32_t>(), 1"
               ,(char (*) [53])"failed: expected (\"1\"_kj.parseAs<uint32_t>()) == (1)",
               (DebugComparison<unsigned_int,_int> *)&_kjCondition,(uint *)&_kjCondition_47,
               (int *)&_kjCondition_51);
  }
  __kjCondition_46 = "0";
  uVar10 = StringPtr::parseAs<unsigned_int>((StringPtr *)&_kjCondition_46);
  _kjCondition.left = (double)(ulong)uVar10;
  _kjCondition.right = (double)anon_var_dwarf_19d17;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar10 == 0);
  if ((uVar10 != 0) && (Debug::minSeverity < 3)) {
    __kjCondition_46 = "0";
    __kjCondition_47 = StringPtr::parseAs<unsigned_int>((StringPtr *)&_kjCondition_46);
    __kjCondition_51 = 0;
    Debug::
    log<char_const(&)[54],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x90,ERROR,
               "\"failed: expected \" \"(\\\"0\\\"_kj.parseAs<uint32_t>()) == (0U)\", _kjCondition, \"0\"_kj.parseAs<uint32_t>(), 0U"
               ,(char (*) [54])"failed: expected (\"0\"_kj.parseAs<uint32_t>()) == (0U)",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition,(uint *)&_kjCondition_47
               ,(uint *)&_kjCondition_51);
  }
  __kjCondition_46 = "4294967295";
  uVar10 = StringPtr::parseAs<unsigned_int>((StringPtr *)&_kjCondition_46);
  _kjCondition.left = (double)CONCAT44(0xffffffff,uVar10);
  _kjCondition.right = (double)anon_var_dwarf_19d17;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar10 == 0xffffffff)
  ;
  if ((uVar10 != 0xffffffff) && (Debug::minSeverity < 3)) {
    __kjCondition_46 = "4294967295";
    __kjCondition_47 = StringPtr::parseAs<unsigned_int>((StringPtr *)&_kjCondition_46);
    __kjCondition_51 = 0xffffffff;
    Debug::
    log<char_const(&)[72],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x91,ERROR,
               "\"failed: expected \" \"(\\\"4294967295\\\"_kj.parseAs<uint32_t>()) == (4294967295U)\", _kjCondition, \"4294967295\"_kj.parseAs<uint32_t>(), 4294967295U"
               ,(char (*) [72])
                "failed: expected (\"4294967295\"_kj.parseAs<uint32_t>()) == (4294967295U)",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition,(uint *)&_kjCondition_47
               ,(uint *)&_kjCondition_51);
  }
  local_3c40.content.ptr = "-1";
  local_3c40.content.size_ = 3;
  StringPtr::parseAs<unsigned_int>(&local_3c40);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x92,ERROR,"\"code did not throw: \" \"\\\"-1\\\"_kj.parseAs<uint32_t>()\"",
               (char (*) [48])"code did not throw: \"-1\"_kj.parseAs<uint32_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_3c30.content.ptr = "4294967296";
  local_3c30.content.size_ = 0xb;
  StringPtr::parseAs<unsigned_int>(&local_3c30);
  _kjCondition.left = (double)((ulong)_kjCondition.left & 0xffffffffffffff00);
  if (Debug::minSeverity < 3) {
    Debug::log<char_const(&)[56]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x93,ERROR,"\"code did not throw: \" \"\\\"4294967296\\\"_kj.parseAs<uint32_t>()\"",
               (char (*) [56])"code did not throw: \"4294967296\"_kj.parseAs<uint32_t>()");
  }
  if (_kjCondition.left._0_1_ == '\x01') {
    Exception::~Exception((Exception *)&_kjCondition.right);
  }
  local_4268.content.ptr = "1";
  local_4268.content.size_ = 2;
  sVar7 = StringPtr::parseAs<short>((StringPtr *)&local_4268);
  _kjCondition.left = (double)CONCAT62(_kjCondition.left._2_6_,sVar7);
  _kjCondition.left = (double)CONCAT44(1,_kjCondition.left._0_4_);
  _kjCondition.right = (double)anon_var_dwarf_19d17;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,sVar7 == 1);
  if ((sVar7 != 1) && (Debug::minSeverity < 3)) {
    local_4268.content.ptr = "1";
    local_4268.content.size_ = 2;
    sVar7 = StringPtr::parseAs<short>((StringPtr *)&local_4268);
    local_4238[0] = CONCAT22(local_4238[0]._2_2_,sVar7);
    __kjCondition_56 = (char *)CONCAT44(uStack_4244,1);
    Debug::log<char_const(&)[52],kj::_::DebugComparison<short,int>&,short,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x95,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<int16_t>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<int16_t>(), 1"
               ,(char (*) [52])"failed: expected (\"1\"_kj.parseAs<int16_t>()) == (1)",
               (DebugComparison<short,_int> *)&_kjCondition,(short *)local_4238,
               (int *)&_kjCondition_56);
  }
  local_4268.content.ptr = "1";
  local_4268.content.size_ = 2;
  uVar8 = StringPtr::parseAs<unsigned_short>((StringPtr *)&local_4268);
  _kjCondition.left = (double)CONCAT62(_kjCondition.left._2_6_,uVar8);
  _kjCondition.left = (double)CONCAT44(1,_kjCondition.left._0_4_);
  _kjCondition.right = (double)anon_var_dwarf_19d17;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar8 == 1);
  if ((uVar8 != 1) && (Debug::minSeverity < 3)) {
    local_4268.content.ptr = "1";
    local_4268.content.size_ = 2;
    uVar8 = StringPtr::parseAs<unsigned_short>((StringPtr *)&local_4268);
    local_4238[0] = CONCAT22(local_4238[0]._2_2_,uVar8);
    __kjCondition_56 = (char *)CONCAT44(uStack_4244,1);
    Debug::log<char_const(&)[53],kj::_::DebugComparison<unsigned_short,int>&,unsigned_short,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x96,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<uint16_t>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<uint16_t>(), 1"
               ,(char (*) [53])"failed: expected (\"1\"_kj.parseAs<uint16_t>()) == (1)",
               (DebugComparison<unsigned_short,_int> *)&_kjCondition,(unsigned_short *)local_4238,
               (int *)&_kjCondition_56);
  }
  local_4268.content.ptr = "1";
  local_4268.content.size_ = 2;
  cVar5 = StringPtr::parseAs<signed_char>((StringPtr *)&local_4268);
  _kjCondition.left = (double)CONCAT71(_kjCondition.left._1_7_,cVar5);
  _kjCondition.left = (double)CONCAT44(1,_kjCondition.left._0_4_);
  _kjCondition.right = (double)anon_var_dwarf_19d17;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,cVar5 == '\x01');
  if ((cVar5 != '\x01') && (Debug::minSeverity < 3)) {
    local_4268.content.ptr = "1";
    local_4268.content.size_ = 2;
    cVar5 = StringPtr::parseAs<signed_char>((StringPtr *)&local_4268);
    local_4238[0] = CONCAT31(local_4238[0]._1_3_,cVar5);
    __kjCondition_56 = (char *)CONCAT44(uStack_4244,1);
    Debug::log<char_const(&)[51],kj::_::DebugComparison<signed_char,int>&,signed_char,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x97,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<int8_t>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<int8_t>(), 1"
               ,(char (*) [51])"failed: expected (\"1\"_kj.parseAs<int8_t>()) == (1)",
               (DebugComparison<signed_char,_int> *)&_kjCondition,(char *)local_4238,
               (int *)&_kjCondition_56);
  }
  local_4268.content.ptr = "1";
  local_4268.content.size_ = 2;
  uVar6 = StringPtr::parseAs<unsigned_char>((StringPtr *)&local_4268);
  _kjCondition.left = (double)CONCAT71(_kjCondition.left._1_7_,uVar6);
  _kjCondition.left = (double)CONCAT44(1,_kjCondition.left._0_4_);
  _kjCondition.right = (double)anon_var_dwarf_19d17;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar6 == '\x01');
  if ((uVar6 != '\x01') && (Debug::minSeverity < 3)) {
    local_4268.content.ptr = "1";
    local_4268.content.size_ = 2;
    uVar6 = StringPtr::parseAs<unsigned_char>((StringPtr *)&local_4268);
    local_4238[0] = CONCAT31(local_4238[0]._1_3_,uVar6);
    __kjCondition_56 = (char *)CONCAT44(uStack_4244,1);
    Debug::log<char_const(&)[52],kj::_::DebugComparison<unsigned_char,int>&,unsigned_char,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x98,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<uint8_t>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<uint8_t>(), 1"
               ,(char (*) [52])"failed: expected (\"1\"_kj.parseAs<uint8_t>()) == (1)",
               (DebugComparison<unsigned_char,_int> *)&_kjCondition,(uchar *)local_4238,
               (int *)&_kjCondition_56);
  }
  local_4268.content.ptr = "1";
  local_4268.content.size_ = 2;
  cVar5 = StringPtr::parseAs<char>((StringPtr *)&local_4268);
  _kjCondition.left = (double)CONCAT71(_kjCondition.left._1_7_,cVar5);
  _kjCondition.left = (double)CONCAT44(1,_kjCondition.left._0_4_);
  _kjCondition.right = (double)anon_var_dwarf_19d17;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,cVar5 == '\x01');
  if ((cVar5 != '\x01') && (Debug::minSeverity < 3)) {
    local_4268.content.ptr = "1";
    local_4268.content.size_ = 2;
    cVar5 = StringPtr::parseAs<char>((StringPtr *)&local_4268);
    local_4238[0] = CONCAT31(local_4238[0]._1_3_,cVar5);
    __kjCondition_56 = (char *)CONCAT44(uStack_4244,1);
    Debug::log<char_const(&)[49],kj::_::DebugComparison<char,int>&,char,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x99,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<char>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<char>(), 1"
               ,(char (*) [49])"failed: expected (\"1\"_kj.parseAs<char>()) == (1)",
               (DebugComparison<char,_int> *)&_kjCondition,(char *)local_4238,
               (int *)&_kjCondition_56);
  }
  local_4268.content.ptr = "1";
  local_4268.content.size_ = 2;
  cVar5 = StringPtr::parseAs<signed_char>((StringPtr *)&local_4268);
  _kjCondition.left = (double)CONCAT71(_kjCondition.left._1_7_,cVar5);
  _kjCondition.left = (double)CONCAT44(1,_kjCondition.left._0_4_);
  _kjCondition.right = (double)anon_var_dwarf_19d17;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,cVar5 == '\x01');
  if ((cVar5 != '\x01') && (Debug::minSeverity < 3)) {
    local_4268.content.ptr = "1";
    local_4268.content.size_ = 2;
    cVar5 = StringPtr::parseAs<signed_char>((StringPtr *)&local_4268);
    local_4238[0] = CONCAT31(local_4238[0]._1_3_,cVar5);
    __kjCondition_56 = (char *)CONCAT44(uStack_4244,1);
    Debug::log<char_const(&)[56],kj::_::DebugComparison<signed_char,int>&,signed_char,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x9a,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<signed char>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<signed char>(), 1"
               ,(char (*) [56])"failed: expected (\"1\"_kj.parseAs<signed char>()) == (1)",
               (DebugComparison<signed_char,_int> *)&_kjCondition,(char *)local_4238,
               (int *)&_kjCondition_56);
  }
  local_4268.content.ptr = "1";
  local_4268.content.size_ = 2;
  uVar6 = StringPtr::parseAs<unsigned_char>((StringPtr *)&local_4268);
  _kjCondition.left = (double)CONCAT71(_kjCondition.left._1_7_,uVar6);
  _kjCondition.left = (double)CONCAT44(1,_kjCondition.left._0_4_);
  _kjCondition.right = (double)anon_var_dwarf_19d17;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar6 == '\x01');
  if ((uVar6 != '\x01') && (Debug::minSeverity < 3)) {
    local_4268.content.ptr = "1";
    local_4268.content.size_ = 2;
    uVar6 = StringPtr::parseAs<unsigned_char>((StringPtr *)&local_4268);
    local_4238[0] = CONCAT31(local_4238[0]._1_3_,uVar6);
    __kjCondition_56 = (char *)CONCAT44(uStack_4244,1);
    Debug::log<char_const(&)[58],kj::_::DebugComparison<unsigned_char,int>&,unsigned_char,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x9b,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<unsigned char>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<unsigned char>(), 1"
               ,(char (*) [58])"failed: expected (\"1\"_kj.parseAs<unsigned char>()) == (1)",
               (DebugComparison<unsigned_char,_int> *)&_kjCondition,(uchar *)local_4238,
               (int *)&_kjCondition_56);
  }
  local_4268.content.ptr = "1";
  local_4268.content.size_ = 2;
  sVar7 = StringPtr::parseAs<short>((StringPtr *)&local_4268);
  _kjCondition.left = (double)CONCAT62(_kjCondition.left._2_6_,sVar7);
  _kjCondition.left = (double)CONCAT44(1,_kjCondition.left._0_4_);
  _kjCondition.right = (double)anon_var_dwarf_19d17;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,sVar7 == 1);
  if ((sVar7 != 1) && (Debug::minSeverity < 3)) {
    local_4268.content.ptr = "1";
    local_4268.content.size_ = 2;
    sVar7 = StringPtr::parseAs<short>((StringPtr *)&local_4268);
    local_4238[0] = CONCAT22(local_4238[0]._2_2_,sVar7);
    __kjCondition_56 = (char *)CONCAT44(uStack_4244,1);
    Debug::log<char_const(&)[50],kj::_::DebugComparison<short,int>&,short,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x9c,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<short>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<short>(), 1"
               ,(char (*) [50])"failed: expected (\"1\"_kj.parseAs<short>()) == (1)",
               (DebugComparison<short,_int> *)&_kjCondition,(short *)local_4238,
               (int *)&_kjCondition_56);
  }
  local_4268.content.ptr = "1";
  local_4268.content.size_ = 2;
  uVar8 = StringPtr::parseAs<unsigned_short>((StringPtr *)&local_4268);
  _kjCondition.left = (double)CONCAT62(_kjCondition.left._2_6_,uVar8);
  _kjCondition.left = (double)CONCAT44(1,_kjCondition.left._0_4_);
  _kjCondition.right = (double)anon_var_dwarf_19d17;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar8 == 1);
  if ((uVar8 != 1) && (Debug::minSeverity < 3)) {
    local_4268.content.ptr = "1";
    local_4268.content.size_ = 2;
    uVar8 = StringPtr::parseAs<unsigned_short>((StringPtr *)&local_4268);
    local_4238[0] = CONCAT22(local_4238[0]._2_2_,uVar8);
    __kjCondition_56 = (char *)CONCAT44(uStack_4244,1);
    Debug::log<char_const(&)[59],kj::_::DebugComparison<unsigned_short,int>&,unsigned_short,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x9d,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<unsigned short>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<unsigned short>(), 1"
               ,(char (*) [59])"failed: expected (\"1\"_kj.parseAs<unsigned short>()) == (1)",
               (DebugComparison<unsigned_short,_int> *)&_kjCondition,(unsigned_short *)local_4238,
               (int *)&_kjCondition_56);
  }
  local_4268.content.ptr = "1";
  local_4268.content.size_ = 2;
  iVar9 = StringPtr::parseAs<int>((StringPtr *)&local_4268);
  _kjCondition.left = (double)CONCAT44(1,iVar9);
  _kjCondition.right = (double)anon_var_dwarf_19d17;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar9 == 1);
  if ((iVar9 != 1) && (Debug::minSeverity < 3)) {
    local_4268.content.ptr = "1";
    local_4268.content.size_ = 2;
    iVar9 = StringPtr::parseAs<int>((StringPtr *)&local_4268);
    __kjCondition_56 = (char *)CONCAT44(uStack_4244,iVar9);
    local_4238[0] = 1;
    Debug::log<char_const(&)[48],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x9e,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<int>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<int>(), 1"
               ,(char (*) [48])"failed: expected (\"1\"_kj.parseAs<int>()) == (1)",
               (DebugComparison<int,_int> *)&_kjCondition,(int *)&_kjCondition_56,local_4238);
  }
  local_4268.content.ptr = "1";
  local_4268.content.size_ = 2;
  uVar10 = StringPtr::parseAs<unsigned_int>((StringPtr *)&local_4268);
  _kjCondition.left = (double)CONCAT44(1,uVar10);
  _kjCondition.right = (double)anon_var_dwarf_19d17;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar10 == 1);
  if ((uVar10 != 1) && (Debug::minSeverity < 3)) {
    local_4268.content.ptr = "1";
    local_4268.content.size_ = 2;
    uVar10 = StringPtr::parseAs<unsigned_int>((StringPtr *)&local_4268);
    __kjCondition_56 = (char *)CONCAT44(uStack_4244,uVar10);
    local_4238[0] = 1;
    Debug::log<char_const(&)[53],kj::_::DebugComparison<unsigned_int,int>&,unsigned_int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0x9f,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<unsigned>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<unsigned>(), 1"
               ,(char (*) [53])"failed: expected (\"1\"_kj.parseAs<unsigned>()) == (1)",
               (DebugComparison<unsigned_int,_int> *)&_kjCondition,(uint *)&_kjCondition_56,
               local_4238);
  }
  local_4268.content.ptr = "1";
  local_4268.content.size_ = 2;
  _kjCondition.left = (double)StringPtr::parseAs<long>((StringPtr *)&local_4268);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 4.94065645841247e-324;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    local_4268.content.ptr = "1";
    local_4268.content.size_ = 2;
    __kjCondition_56 = (char *)StringPtr::parseAs<long>((StringPtr *)&local_4268);
    local_4238[0] = 1;
    Debug::log<char_const(&)[49],kj::_::DebugComparison<long,int>&,long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xa0,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<long>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<long>(), 1"
               ,(char (*) [49])"failed: expected (\"1\"_kj.parseAs<long>()) == (1)",
               (DebugComparison<long,_int> *)&_kjCondition,(long *)&_kjCondition_56,local_4238);
  }
  local_4268.content.ptr = "1";
  local_4268.content.size_ = 2;
  _kjCondition.left = (double)StringPtr::parseAs<unsigned_long>((StringPtr *)&local_4268);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 4.94065645841247e-324;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    local_4268.content.ptr = "1";
    local_4268.content.size_ = 2;
    __kjCondition_56 = (char *)StringPtr::parseAs<unsigned_long>((StringPtr *)&local_4268);
    local_4238[0] = 1;
    Debug::log<char_const(&)[58],kj::_::DebugComparison<unsigned_long,int>&,unsigned_long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xa1,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<unsigned long>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<unsigned long>(), 1"
               ,(char (*) [58])"failed: expected (\"1\"_kj.parseAs<unsigned long>()) == (1)",
               (DebugComparison<unsigned_long,_int> *)&_kjCondition,
               (unsigned_long *)&_kjCondition_56,local_4238);
  }
  local_4268.content.ptr = "1";
  local_4268.content.size_ = 2;
  _kjCondition.left = (double)StringPtr::parseAs<long_long>((StringPtr *)&local_4268);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 4.94065645841247e-324;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    local_4268.content.ptr = "1";
    local_4268.content.size_ = 2;
    __kjCondition_56 = (char *)StringPtr::parseAs<long_long>((StringPtr *)&local_4268);
    local_4238[0] = 1;
    Debug::log<char_const(&)[54],kj::_::DebugComparison<long_long,int>&,long_long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xa2,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<long long>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<long long>(), 1"
               ,(char (*) [54])"failed: expected (\"1\"_kj.parseAs<long long>()) == (1)",
               (DebugComparison<long_long,_int> *)&_kjCondition,(longlong *)&_kjCondition_56,
               local_4238);
  }
  local_4268.content.ptr = "1";
  local_4268.content.size_ = 2;
  _kjCondition.left = (double)StringPtr::parseAs<unsigned_long_long>((StringPtr *)&local_4268);
  _kjCondition.right = (double)CONCAT44(_kjCondition.right._4_4_,1);
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 4.94065645841247e-324;
  if ((!_kjCondition.result) && (Debug::minSeverity < 3)) {
    local_4268.content.ptr = "1";
    local_4268.content.size_ = 2;
    __kjCondition_56 = (char *)StringPtr::parseAs<unsigned_long_long>((StringPtr *)&local_4268);
    local_4238[0] = 1;
    Debug::
    log<char_const(&)[63],kj::_::DebugComparison<unsigned_long_long,int>&,unsigned_long_long,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xa3,ERROR,
               "\"failed: expected \" \"(\\\"1\\\"_kj.parseAs<unsigned long long>()) == (1)\", _kjCondition, \"1\"_kj.parseAs<unsigned long long>(), 1"
               ,(char (*) [63])"failed: expected (\"1\"_kj.parseAs<unsigned long long>()) == (1)",
               (DebugComparison<unsigned_long_long,_int> *)&_kjCondition,
               (unsigned_long_long *)&_kjCondition_56,local_4238);
  }
  heapString(&local_4268,"1",1);
  __kjCondition_56 = local_4268.content.ptr;
  if (local_4268.content.size_ == 0) {
    __kjCondition_56 = "";
  }
  iVar9 = StringPtr::parseAs<int>((StringPtr *)&_kjCondition_56);
  sVar4 = local_4268.content.size_;
  pcVar3 = local_4268.content.ptr;
  _kjCondition.left = (double)CONCAT44(1,iVar9);
  _kjCondition.right = (double)anon_var_dwarf_19d17;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar9 == 1);
  if (local_4268.content.ptr != (char *)0x0) {
    local_4268.content.ptr = (char *)0x0;
    local_4268.content.size_ = 0;
    (**(local_4268.content.disposer)->_vptr_ArrayDisposer)
              (local_4268.content.disposer,pcVar3,1,sVar4,sVar4,0);
  }
  if ((iVar9 != 1) && (Debug::minSeverity < 3)) {
    heapString(&local_4268,"1",1);
    __kjCondition_56 = local_4268.content.ptr;
    if (local_4268.content.size_ == 0) {
      __kjCondition_56 = "";
    }
    local_4238[0] = StringPtr::parseAs<int>((StringPtr *)&_kjCondition_56);
    __kjCondition_56 = (char *)CONCAT44(uStack_4244,1);
    Debug::log<char_const(&)[57],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xa5,ERROR,
               "\"failed: expected \" \"(heapString(\\\"1\\\").parseAs<int>()) == (1)\", _kjCondition, heapString(\"1\").parseAs<int>(), 1"
               ,(char (*) [57])"failed: expected (heapString(\"1\").parseAs<int>()) == (1)",
               (DebugComparison<int,_int> *)&_kjCondition,local_4238,(int *)&_kjCondition_56);
    sVar4 = local_4268.content.size_;
    pcVar3 = local_4268.content.ptr;
    if (local_4268.content.ptr != (char *)0x0) {
      local_4268.content.ptr = (char *)0x0;
      local_4268.content.size_ = 0;
      (**(local_4268.content.disposer)->_vptr_ArrayDisposer)
                (local_4268.content.disposer,pcVar3,1,sVar4,sVar4,0);
    }
  }
  return;
}

Assistant:

TEST(String, parseAs) {
  EXPECT_EQ("0"_kj.parseAs<double>(), 0.0);
  EXPECT_EQ("0.0"_kj.parseAs<double>(), 0.0);
  EXPECT_EQ("1"_kj.parseAs<double>(), 1.0);
  EXPECT_EQ("1.0"_kj.parseAs<double>(), 1.0);
  EXPECT_EQ("1e100"_kj.parseAs<double>(), 1e100);
  EXPECT_EQ("inf"_kj.parseAs<double>(), inf());
  EXPECT_EQ("infinity"_kj.parseAs<double>(), inf());
  EXPECT_EQ("INF"_kj.parseAs<double>(), inf());
  EXPECT_EQ("INFINITY"_kj.parseAs<double>(), inf());
  EXPECT_EQ("1e100000"_kj.parseAs<double>(), inf());
  EXPECT_EQ("-inf"_kj.parseAs<double>(), -inf());
  EXPECT_EQ("-infinity"_kj.parseAs<double>(), -inf());
  EXPECT_EQ("-INF"_kj.parseAs<double>(), -inf());
  EXPECT_EQ("-INFINITY"_kj.parseAs<double>(), -inf());
  EXPECT_EQ("-1e100000"_kj.parseAs<double>(), -inf());
  EXPECT_TRUE(isNaN("nan"_kj.parseAs<double>()));
  EXPECT_TRUE(isNaN("NAN"_kj.parseAs<double>()));
  EXPECT_TRUE(isNaN("NaN"_kj.parseAs<double>()));
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", ""_kj.parseAs<double>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", "a"_kj.parseAs<double>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", "1a"_kj.parseAs<double>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", "+-1"_kj.parseAs<double>());

  EXPECT_EQ("1"_kj.parseAs<float>(), 1.0);

  EXPECT_EQ("1"_kj.parseAs<int64_t>(), 1);
  EXPECT_EQ("9223372036854775807"_kj.parseAs<int64_t>(), 9223372036854775807LL);
  EXPECT_EQ("-9223372036854775808"_kj.parseAs<int64_t>(), -9223372036854775808ULL);
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("out-of-range", "9223372036854775808"_kj.parseAs<int64_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("out-of-range", "-9223372036854775809"_kj.parseAs<int64_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", ""_kj.parseAs<int64_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", "a"_kj.parseAs<int64_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", "1a"_kj.parseAs<int64_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", "+-1"_kj.parseAs<int64_t>());
  EXPECT_EQ("010"_kj.parseAs<int64_t>(), 10);
  EXPECT_EQ("0010"_kj.parseAs<int64_t>(), 10);
  EXPECT_EQ("0x10"_kj.parseAs<int64_t>(), 16);
  EXPECT_EQ("0X10"_kj.parseAs<int64_t>(), 16);
  EXPECT_EQ("-010"_kj.parseAs<int64_t>(), -10);
  EXPECT_EQ("-0x10"_kj.parseAs<int64_t>(), -16);
  EXPECT_EQ("-0X10"_kj.parseAs<int64_t>(), -16);

  EXPECT_EQ("1"_kj.parseAs<uint64_t>(), 1);
  EXPECT_EQ("0"_kj.parseAs<uint64_t>(), 0);
  EXPECT_EQ("18446744073709551615"_kj.parseAs<uint64_t>(), 18446744073709551615ULL);
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("out-of-range", "-1"_kj.parseAs<uint64_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("out-of-range", "18446744073709551616"_kj.parseAs<uint64_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", ""_kj.parseAs<uint64_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", "a"_kj.parseAs<uint64_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", "1a"_kj.parseAs<uint64_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("not contain valid", "+-1"_kj.parseAs<uint64_t>());

  EXPECT_EQ("1"_kj.parseAs<int32_t>(), 1);
  EXPECT_EQ("2147483647"_kj.parseAs<int32_t>(), 2147483647);
  EXPECT_EQ("-2147483648"_kj.parseAs<int32_t>(), -2147483648);
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("out-of-range", "2147483648"_kj.parseAs<int32_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("out-of-range", "-2147483649"_kj.parseAs<int32_t>());

  EXPECT_EQ("1"_kj.parseAs<uint32_t>(), 1);
  EXPECT_EQ("0"_kj.parseAs<uint32_t>(), 0U);
  EXPECT_EQ("4294967295"_kj.parseAs<uint32_t>(), 4294967295U);
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("out-of-range", "-1"_kj.parseAs<uint32_t>());
  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("out-of-range", "4294967296"_kj.parseAs<uint32_t>());

  EXPECT_EQ("1"_kj.parseAs<int16_t>(), 1);
  EXPECT_EQ("1"_kj.parseAs<uint16_t>(), 1);
  EXPECT_EQ("1"_kj.parseAs<int8_t>(), 1);
  EXPECT_EQ("1"_kj.parseAs<uint8_t>(), 1);
  EXPECT_EQ("1"_kj.parseAs<char>(), 1);
  EXPECT_EQ("1"_kj.parseAs<signed char>(), 1);
  EXPECT_EQ("1"_kj.parseAs<unsigned char>(), 1);
  EXPECT_EQ("1"_kj.parseAs<short>(), 1);
  EXPECT_EQ("1"_kj.parseAs<unsigned short>(), 1);
  EXPECT_EQ("1"_kj.parseAs<int>(), 1);
  EXPECT_EQ("1"_kj.parseAs<unsigned>(), 1);
  EXPECT_EQ("1"_kj.parseAs<long>(), 1);
  EXPECT_EQ("1"_kj.parseAs<unsigned long>(), 1);
  EXPECT_EQ("1"_kj.parseAs<long long>(), 1);
  EXPECT_EQ("1"_kj.parseAs<unsigned long long>(), 1);

  EXPECT_EQ(heapString("1").parseAs<int>(), 1);
}